

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O3

void __thiscall Filter::update(Filter *this,vector<float,_std::allocator<float>_> *newData)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  pointer pfVar4;
  pointer pfVar5;
  int *piVar6;
  float *pfVar7;
  long *plVar8;
  ulong uVar9;
  float *pfVar10;
  ulong uVar11;
  float *pfVar12;
  
  iVar1 = this->measSize;
  if (0 < (long)iVar1) {
    pfVar4 = (newData->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar5 = (newData->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar2 = *(uint *)&this->meas;
    iVar3 = *(int *)&this->field_0x5c4;
    piVar6 = *(int **)&this->field_0x5f8;
    pfVar7 = *(float **)&this->field_0x5c8;
    plVar8 = *(long **)&this->field_0x600;
    uVar11 = 0;
    pfVar12 = pfVar7;
    do {
      if ((long)pfVar5 - (long)pfVar4 >> 2 == uVar11) {
        return;
      }
      pfVar10 = pfVar12;
      if (((uVar2 >> 0xe & 1) == 0) && (*piVar6 != 1)) {
        if (piVar6[1] == 1) {
          pfVar10 = (float *)(*plVar8 * uVar11 + (long)pfVar7);
        }
        else {
          uVar9 = (ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff;
          pfVar10 = (float *)((long)pfVar7 +
                             (long)(int)((long)uVar9 % (long)iVar3) * 4 +
                             (long)(int)((long)uVar9 / (long)iVar3) * *plVar8);
        }
      }
      *pfVar10 = pfVar4[uVar11];
      uVar11 = uVar11 + 1;
      pfVar12 = pfVar12 + 1;
    } while ((long)iVar1 != uVar11);
  }
  return;
}

Assistant:

void Filter::update(const vector<float> newData) {
    for (int i = 0; i < measSize; i++) {
        if (newData.size() == i)
            return;
        meas.at<float>(i) = newData[i];
    }
}